

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

ostream * operator<<(ostream *ostream,Socket *socket)

{
  string local_30 [32];
  
  (*(socket->super_stream)._vptr_stream[1])(local_30);
  std::operator<<(ostream,local_30);
  std::__cxx11::string::~string(local_30);
  return ostream;
}

Assistant:

std::ostream &operator<<(std::ostream &ostream, blc::network::Socket &socket) {
	ostream << socket.read();
	return (ostream);
}